

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
Assimp::FBX::FBXConverter::ConvertMesh
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          FBXConverter *this,MeshGeometry *mesh,Model *model,aiMatrix4x4 *node_global_transform,
          aiNode *nd)

{
  int iVar1;
  bool bVar2;
  reference ppVar3;
  string *__rhs;
  MatIndexArray *this_00;
  ImportSettings *pIVar4;
  const_reference pvVar5;
  reference piVar6;
  uint local_288;
  int local_284;
  const_iterator cStack_280;
  value_type_conflict2 index;
  const_iterator __end3;
  const_iterator __begin3;
  MatIndexArray *__range3;
  value_type_conflict2 base;
  MatIndexArray *mindices;
  format local_238;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *faces;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *vertices;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_a0;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_98;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_90;
  iterator local_88;
  _Rb_tree_const_iterator<std::pair<const_Assimp::FBX::Geometry_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_80 [3];
  MeshGeometry *local_68;
  iterator local_60;
  _Rb_tree_const_iterator<std::pair<const_Assimp::FBX::Geometry_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_58;
  const_iterator it;
  vector<unsigned_int,_std::allocator<unsigned_int>_> temp;
  aiNode *nd_local;
  aiMatrix4x4 *node_global_transform_local;
  Model *model_local;
  MeshGeometry *mesh_local;
  FBXConverter *this_local;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&it);
  local_68 = mesh;
  local_60._M_node =
       (_Base_ptr)
       std::
       map<const_Assimp::FBX::Geometry_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<const_Assimp::FBX::Geometry_*>,_std::allocator<std::pair<const_Assimp::FBX::Geometry_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
       ::find(&this->meshes_converted,(key_type *)&local_68);
  std::
  _Rb_tree_const_iterator<std::pair<const_Assimp::FBX::Geometry_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::_Rb_tree_const_iterator(&local_58,&local_60);
  local_88._M_node =
       (_Base_ptr)
       std::
       map<const_Assimp::FBX::Geometry_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<const_Assimp::FBX::Geometry_*>,_std::allocator<std::pair<const_Assimp::FBX::Geometry_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
       ::end(&this->meshes_converted);
  std::
  _Rb_tree_const_iterator<std::pair<const_Assimp::FBX::Geometry_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::_Rb_tree_const_iterator(local_80,&local_88);
  bVar2 = std::operator!=(&local_58,local_80);
  if (bVar2) {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_Assimp::FBX::Geometry_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator*(&local_58);
    local_90._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&ppVar3->second);
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_Assimp::FBX::Geometry_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator*(&local_58);
    local_98._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&ppVar3->second);
    local_a0 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&it);
    local_a8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               std::
               copy<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                         (local_90,local_98,
                          (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                           )local_a0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (__return_storage_ptr__,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&it);
  }
  else {
    faces = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)MeshGeometry::GetVertices(mesh);
    local_c0 = MeshGeometry::GetFaceIndexCounts(mesh);
    bVar2 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::empty
                      ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)faces);
    if ((bVar2) ||
       (bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(local_c0), bVar2)) {
      __rhs = FBX::Object::Name_abi_cxx11_((Object *)mesh);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mindices,
                     "ignoring empty geometry: ",__rhs);
      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
      basic_formatter<std::__cxx11::string>
                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_238,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mindices);
      LogFunctions<Assimp::FBXImporter>::LogWarn(&local_238);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_238);
      std::__cxx11::string::~string((string *)&mindices);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (__return_storage_ptr__,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&it);
    }
    else {
      this_00 = MeshGeometry::GetMaterialIndices(mesh);
      pIVar4 = Document::Settings(this->doc);
      if (((pIVar4->readMaterials & 1U) != 0) &&
         (bVar2 = std::vector<int,_std::allocator<int>_>::empty(this_00), !bVar2)) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0);
        iVar1 = *pvVar5;
        __end3 = std::vector<int,_std::allocator<int>_>::begin(this_00);
        cStack_280 = std::vector<int,_std::allocator<int>_>::end(this_00);
        while (bVar2 = __gnu_cxx::operator!=(&__end3,&stack0xfffffffffffffd80), bVar2) {
          piVar6 = __gnu_cxx::
                   __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&__end3);
          local_284 = *piVar6;
          if (local_284 != iVar1) {
            ConvertMeshMultiMaterial
                      (__return_storage_ptr__,this,mesh,model,node_global_transform,nd);
            goto LAB_009d88d0;
          }
          __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
          operator++(&__end3);
        }
      }
      local_288 = ConvertMeshSingleMaterial(this,mesh,model,node_global_transform,nd);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&it,&local_288);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (__return_storage_ptr__,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&it);
    }
  }
LAB_009d88d0:
  vertices._4_4_ = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&it);
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned int> FBXConverter::ConvertMesh(const MeshGeometry& mesh, const Model& model,
            const aiMatrix4x4& node_global_transform, aiNode& nd)
        {
            std::vector<unsigned int> temp;

            MeshMap::const_iterator it = meshes_converted.find(&mesh);
            if (it != meshes_converted.end()) {
                std::copy((*it).second.begin(), (*it).second.end(), std::back_inserter(temp));
                return temp;
            }

            const std::vector<aiVector3D>& vertices = mesh.GetVertices();
            const std::vector<unsigned int>& faces = mesh.GetFaceIndexCounts();
            if (vertices.empty() || faces.empty()) {
                FBXImporter::LogWarn("ignoring empty geometry: " + mesh.Name());
                return temp;
            }

            // one material per mesh maps easily to aiMesh. Multiple material
            // meshes need to be split.
            const MatIndexArray& mindices = mesh.GetMaterialIndices();
            if (doc.Settings().readMaterials && !mindices.empty()) {
                const MatIndexArray::value_type base = mindices[0];
                for (MatIndexArray::value_type index : mindices) {
                    if (index != base) {
                        return ConvertMeshMultiMaterial(mesh, model, node_global_transform, nd);
                    }
                }
            }

            // faster code-path, just copy the data
            temp.push_back(ConvertMeshSingleMaterial(mesh, model, node_global_transform, nd));
            return temp;
        }